

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# exception-test.c++
# Opt level: O0

void __thiscall
kj::_::anon_unknown_0::ThrowingDestructor::~ThrowingDestructor(ThrowingDestructor *this)

{
  anon_class_1_0_00000001 local_11;
  ThrowingDestructor *local_10;
  ThrowingDestructor *this_local;
  
  local_10 = this;
  UnwindDetector::
  catchExceptionsIfUnwinding<kj::_::(anonymous_namespace)::ThrowingDestructor::~ThrowingDestructor()::_lambda()_1_>
            (&this->super_UnwindDetector,&local_11);
  return;
}

Assistant:

~ThrowingDestructor() noexcept(false) {
    catchExceptionsIfUnwinding([]() {
      KJ_FAIL_ASSERT("this is a test, not a real bug");
    });
  }